

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_viewer.c
# Opt level: O0

void oonf_viewer_output_print_line(oonf_viewer_template *template)

{
  oonf_viewer_template *template_local;
  
  if ((template->create_json & 1U) == 0) {
    abuf_add_template(template->out,template->_storage,false);
    abuf_puts(template->out,"\n");
  }
  else {
    json_start_object(&template->_json,(char *)0x0);
    json_print_templates(&template->_json,template->data,template->data_size);
    json_end_object(&template->_json);
  }
  return;
}

Assistant:

void
oonf_viewer_output_print_line(struct oonf_viewer_template *template) {
  if (!template->create_json) {
    abuf_add_template(template->out, template->_storage, false);
    abuf_puts(template->out, "\n");
  }
  else {
    /* JSON output */
    json_start_object(&template->_json, NULL);
    json_print_templates(&template->_json, template->data, template->data_size);
    json_end_object(&template->_json);
  }
}